

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall flatbuffers::cpp::CppGenerator::GenIncludeDependencies(CppGenerator *this)

{
  Parser *pPVar1;
  pointer pbVar2;
  pointer pIVar3;
  long *plVar4;
  long lVar5;
  size_type *psVar6;
  long *plVar7;
  pointer __rhs;
  pointer pIVar8;
  string name_without_ext;
  string basename;
  vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> included_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  string local_108;
  string local_e8;
  string local_c8;
  vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> local_a8;
  CodeWriter *local_90;
  string *local_88;
  IDLOptions *local_80;
  IncludedFile *local_78;
  string local_70;
  string local_50;
  
  if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
    pPVar1 = (this->super_BaseGenerator).parser_;
    __rhs = (pPVar1->native_included_files_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pPVar1->native_included_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__rhs != pbVar2) {
      do {
        std::operator+(&local_148,"#include \"",__rhs);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_148);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_c8.field_2._M_allocated_capacity = *psVar6;
          local_c8.field_2._8_8_ = plVar4[3];
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar6;
          local_c8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        CodeWriter::operator+=(&this->code_,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        __rhs = __rhs + 1;
      } while (__rhs != pbVar2);
    }
  }
  Parser::GetIncludedFiles(&local_a8,(this->super_BaseGenerator).parser_);
  pIVar3 = local_a8.
           super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar8 = local_a8.
           super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_a8.
      super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = (long)local_a8.
                  super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_a8.
                  super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>,_flatbuffers::IncludedFile>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>,_flatbuffers::IncludedFile>
                         *)&local_148,
                        (__normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>
                         )local_a8.
                          super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                        (lVar5 - (lVar5 + 1 >> 0x3f)) + 1 >> 1);
    if (local_148.field_2._M_allocated_capacity == 0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<flatbuffers::IncludedFile*,std::vector<flatbuffers::IncludedFile,std::allocator<flatbuffers::IncludedFile>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar8,pIVar3);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<flatbuffers::IncludedFile*,std::vector<flatbuffers::IncludedFile,std::allocator<flatbuffers::IncludedFile>>>,flatbuffers::IncludedFile*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar8,pIVar3,local_148.field_2._M_allocated_capacity,local_148._M_string_length);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>,_flatbuffers::IncludedFile>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>,_flatbuffers::IncludedFile>
                *)&local_148);
    local_78 = local_a8.
               super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_a8.
        super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_a8.
        super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_80 = &(this->opts_).super_IDLOptions;
      local_88 = &(this->opts_).super_IDLOptions.include_prefix;
      local_90 = &this->code_;
      pIVar8 = local_a8.
               super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        StripExtension(&local_148,&pIVar8->schema_name);
        if ((this->opts_).super_IDLOptions.keep_prefix == true) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_148._M_dataplus._M_p,
                     local_148._M_dataplus._M_p + local_148._M_string_length);
        }
        else {
          StripPath(&local_e8,&local_148);
        }
        BaseGenerator::GeneratedFileName
                  (&local_50,&this->super_BaseGenerator,local_88,&local_e8,local_80);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x35e7c0);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_118 = *plVar7;
          lStack_110 = plVar4[3];
          local_128 = &local_118;
        }
        else {
          local_118 = *plVar7;
          local_128 = (long *)*plVar4;
        }
        local_120 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_108.field_2._M_allocated_capacity = *psVar6;
          local_108.field_2._8_8_ = plVar4[3];
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar6;
          local_108._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_108._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        CodeWriter::operator+=(local_90,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128,local_118 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        pIVar8 = pIVar8 + 1;
      } while (pIVar8 != local_78);
    }
  }
  pPVar1 = (this->super_BaseGenerator).parser_;
  if (((pPVar1->native_included_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (pPVar1->native_included_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (local_a8.
      super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    CodeWriter::operator+=(&this->code_,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::~vector
            (&local_a8);
  return;
}

Assistant:

void GenIncludeDependencies() {
    if (opts_.generate_object_based_api) {
      for (const std::string &native_included_file :
           parser_.native_included_files_) {
        code_ += "#include \"" + native_included_file + "\"";
      }
    }

    // Get the directly included file of the file being parsed.
    std::vector<IncludedFile> included_files(parser_.GetIncludedFiles());

    // We are safe to sort them alphabetically, since there shouldn't be any
    // interdependence between them.
    std::stable_sort(included_files.begin(), included_files.end());

    for (const IncludedFile &included_file : included_files) {
      // Get the name of the included file as defined by the schema, and strip
      // the .fbs extension.
      const std::string name_without_ext =
          StripExtension(included_file.schema_name);

      // If we are told to keep the prefix of the included schema, leave it
      // unchanged, otherwise strip the leading path off so just the "basename"
      // of the include is retained.
      const std::string basename =
          opts_.keep_prefix ? name_without_ext : StripPath(name_without_ext);

      code_ += "#include \"" +
               GeneratedFileName(opts_.include_prefix, basename, opts_) + "\"";
    }

    if (!parser_.native_included_files_.empty() || !included_files.empty()) {
      code_ += "";
    }
  }